

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O1

long __thiscall
gl4cts::anon_unknown_0::AdvancedIndirectAddressingCase1CS::Run
          (AdvancedIndirectAddressingCase1CS *this)

{
  CallLogWrapper *this_00;
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  GLuint GVar5;
  void *pvVar6;
  byte bVar7;
  long lVar8;
  float data [16];
  string local_78;
  undefined8 local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined8 uStack_40;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,
             "\nlayout(local_size_x = 2, local_size_y = 2) in;\nstruct Material {\n  vec3 color;\n};\nlayout(binding = 0, std430) buffer MaterialBuffer {\n  Material g_material[4];\n};\nlayout(binding = 1, std430) buffer MaterialIDBuffer {\n  uint g_material_id[4];\n};\nlayout(binding = 2, std430) buffer TransformBuffer {\n  vec2 translation[4];\n} g_transform;\nlayout(binding = 3, std430) buffer TransformIDBuffer {\n  uint g_transform_id[4];\n};\nlayout(binding = 4, std430) buffer OutputBuffer {\n  vec3 color[16];\n  vec2 pos[16];\n};\nvec2 g_in_position[4] = vec2[4](vec2(-0.4f, -0.4f), vec2(0.4f, -0.4f), vec2(-0.4f, 0.4f), vec2(0.4f, 0.4f));\nvoid main() {\n  uint mid = g_material_id[gl_WorkGroupID.x];\n  Material m = g_material[mid];\n  uint tid = g_transform_id[gl_WorkGroupID.x];\n  vec2 t = g_transform.translation[tid];\n  pos[gl_LocalInvocationIndex + gl_WorkGroupID.x * gl_WorkGroupSize.x * gl_WorkGroupSize.y] \n    = g_in_position[gl_LocalInvocationIndex] + t;\n  color[gl_LocalInvocationIndex + gl_WorkGroupID.x * gl_WorkGroupSize.x * gl_WorkGroupSize.y] = m.color;\n}"
             ,"");
  GVar5 = ShaderStorageBufferObjectBase::CreateProgramCS
                    (&this->super_ShaderStorageBufferObjectBase,&local_78);
  this->m_program = GVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
  bVar4 = ShaderStorageBufferObjectBase::CheckProgram
                    (&this->super_ShaderStorageBufferObjectBase,this->m_program);
  lVar8 = -1;
  if (bVar4) {
    glu::CallLogWrapper::glGenBuffers(this_00,5,this->m_storage_buffer);
    local_48 = &DAT_3f8000003f800000;
    uStack_40 = 0x3f80000000000000;
    local_58 = 0;
    puStack_50 = &DAT_3f8000003f800000;
    local_78.field_2._M_allocated_capacity = 0x3f80000000000000;
    local_78.field_2._8_8_ = 0x3f80000000000000;
    local_78._M_dataplus._M_p = (pointer)0x3f800000;
    local_78._M_string_length = 0x3f80000000000000;
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer[0]);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x40,&local_78,0x88e8);
    local_78._M_dataplus._M_p = (pointer)0x300000002;
    local_78._M_string_length = 0x200000000;
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_storage_buffer[1]);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x10,&local_78,0x88e8);
    local_78.field_2._M_allocated_capacity = 0x3f000000bf000000;
    local_78.field_2._8_8_ = &DAT_3f0000003f000000;
    local_78._M_dataplus._M_p = (pointer)0xbf000000bf000000;
    local_78._M_string_length = 0xbf0000003f000000;
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,2,this->m_storage_buffer[2]);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x20,&local_78,0x88e8);
    local_78._M_dataplus._M_p = (pointer)0x100000003;
    local_78._M_string_length = 0x200000000;
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,3,this->m_storage_buffer[3]);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x10,&local_78,0x88e8);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,4,this->m_storage_buffer[4]);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x180,(void *)0x0,0x88e4);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    glu::CallLogWrapper::glDispatchCompute(this_00,4,1,1);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    pvVar6 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x180,1);
    if (pvVar6 != (void *)0x0) {
      bVar7 = 1;
      lVar8 = 0;
      do {
        fVar1 = *(float *)((long)pvVar6 + lVar8);
        fVar2 = *(float *)((long)&DAT_01a93850 + lVar8);
        if ((((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) ||
            (fVar3 = *(float *)((long)pvVar6 + lVar8 + 4),
            fVar3 != *(float *)((long)&DAT_01a93854 + lVar8))) ||
           (NAN(fVar3) || NAN(*(float *)((long)&DAT_01a93854 + lVar8)))) {
LAB_00976917:
          anon_unknown_0::Output
                    ("Received: %f, %f, %f, but expected: %f, %f, %f\n",SUB84((double)fVar1,0),
                     (double)*(float *)((long)pvVar6 + lVar8 + 4),
                     (double)*(float *)((long)pvVar6 + lVar8 + 8),(double)fVar2,
                     (double)*(float *)((long)&DAT_01a93854 + lVar8),
                     (double)*(float *)((long)&DAT_01a93858 + lVar8));
          bVar7 = 0;
        }
        else {
          fVar3 = *(float *)((long)pvVar6 + lVar8 + 8);
          if ((fVar3 != *(float *)((long)&DAT_01a93858 + lVar8)) ||
             (NAN(fVar3) || NAN(*(float *)((long)&DAT_01a93858 + lVar8)))) goto LAB_00976917;
        }
        lVar8 = lVar8 + 0x10;
      } while (lVar8 != 0x100);
      lVar8 = 0;
      do {
        fVar1 = *(float *)((long)pvVar6 + lVar8 * 8 + 0x100);
        if ((1e-06 < ABS(fVar1 - (float)(&DAT_01a93950)[lVar8 * 2])) ||
           (1e-06 < ABS(*(float *)((long)pvVar6 + lVar8 * 8 + 0x104) -
                        (float)(&DAT_01a93954)[lVar8 * 2]))) {
          anon_unknown_0::Output
                    ("Received: %f, %f, but expected: %f, %f\n",SUB84((double)fVar1,0),
                     (double)*(float *)((long)pvVar6 + lVar8 * 8 + 0x104),
                     (double)(float)(&DAT_01a93950)[lVar8 * 2],
                     (double)(float)(&DAT_01a93954)[lVar8 * 2]);
          bVar7 = 0;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x10);
      glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
      local_78._M_dataplus._M_p = (pointer)0x200000003;
      local_78._M_string_length = 1;
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[1]);
      glu::CallLogWrapper::glBufferSubData(this_00,0x90d2,0,0x10,&local_78);
      local_78._M_dataplus._M_p = (pointer)0x100000000;
      local_78._M_string_length = 0x300000002;
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[3]);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x10,&local_78,0x88e8);
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
      glu::CallLogWrapper::glDispatchCompute(this_00,4,1,1);
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[4]);
      glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
      pvVar6 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x180,1);
      lVar8 = -1;
      if (pvVar6 != (void *)0x0) {
        lVar8 = 0;
        do {
          fVar1 = *(float *)((long)pvVar6 + lVar8);
          fVar2 = *(float *)((long)&DAT_01a939d0 + lVar8);
          if ((((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) ||
              (fVar3 = *(float *)((long)pvVar6 + lVar8 + 4),
              fVar3 != *(float *)((long)&DAT_01a939d4 + lVar8))) ||
             (NAN(fVar3) || NAN(*(float *)((long)&DAT_01a939d4 + lVar8)))) {
LAB_00976b32:
            anon_unknown_0::Output
                      ("Received: %f, %f, %f, but expected: %f, %f, %f\n",SUB84((double)fVar1,0),
                       (double)*(float *)((long)pvVar6 + lVar8 + 4),
                       (double)*(float *)((long)pvVar6 + lVar8 + 8),(double)fVar2,
                       (double)*(float *)((long)&DAT_01a939d4 + lVar8),
                       (double)*(float *)((long)&DAT_01a939d8 + lVar8));
            bVar7 = 0;
          }
          else {
            fVar3 = *(float *)((long)pvVar6 + lVar8 + 8);
            if ((fVar3 != *(float *)((long)&DAT_01a939d8 + lVar8)) ||
               (NAN(fVar3) || NAN(*(float *)((long)&DAT_01a939d8 + lVar8)))) goto LAB_00976b32;
          }
          lVar8 = lVar8 + 0x10;
        } while (lVar8 != 0x100);
        lVar8 = 0;
        do {
          fVar1 = *(float *)((long)pvVar6 + lVar8 * 8 + 0x100);
          if ((1e-06 < ABS(fVar1 - (float)(&DAT_01a93ad0)[lVar8 * 2])) ||
             (1e-06 < ABS(*(float *)((long)pvVar6 + lVar8 * 8 + 0x104) -
                          (float)(&DAT_01a93ad4)[lVar8 * 2]))) {
            anon_unknown_0::Output
                      ("Received: %f, %f, but expected: %f, %f\n",SUB84((double)fVar1,0),
                       (double)*(float *)((long)pvVar6 + lVar8 * 8 + 0x104),
                       (double)(float)(&DAT_01a93ad0)[lVar8 * 2],
                       (double)(float)(&DAT_01a93ad4)[lVar8 * 2]);
            bVar7 = 0;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x10);
        lVar8 = -(ulong)(~bVar7 & 1);
      }
    }
  }
  return lVar8;
}

Assistant:

virtual long Run()
	{
		bool status = true;

		const char* const glsl_cs =
			NL "layout(local_size_x = 2, local_size_y = 2) in;" NL "struct Material {" NL "  vec3 color;" NL "};" NL
			   "layout(binding = 0, std430) buffer MaterialBuffer {" NL "  Material g_material[4];" NL "};" NL
			   "layout(binding = 1, std430) buffer MaterialIDBuffer {" NL "  uint g_material_id[4];" NL "};" NL
			   "layout(binding = 2, std430) buffer TransformBuffer {" NL "  vec2 translation[4];" NL "} g_transform;" NL
			   "layout(binding = 3, std430) buffer TransformIDBuffer {" NL "  uint g_transform_id[4];" NL "};" NL
			   "layout(binding = 4, std430) buffer OutputBuffer {" NL "  vec3 color[16];" NL "  vec2 pos[16];" NL
			   "};" NL "vec2 g_in_position[4] = vec2[4](vec2(-0.4f, -0.4f), vec2(0.4f, -0.4f), vec2(-0.4f, 0.4f), "
			   "vec2(0.4f, 0.4f));" NL "void main() {" NL "  uint mid = g_material_id[gl_WorkGroupID.x];" NL
			   "  Material m = g_material[mid];" NL "  uint tid = g_transform_id[gl_WorkGroupID.x];" NL
			   "  vec2 t = g_transform.translation[tid];" NL
			   "  pos[gl_LocalInvocationIndex + gl_WorkGroupID.x * gl_WorkGroupSize.x * gl_WorkGroupSize.y] " NL
			   "    = g_in_position[gl_LocalInvocationIndex] + t;" NL "  color[gl_LocalInvocationIndex + "
			   "gl_WorkGroupID.x * gl_WorkGroupSize.x * "
			   "gl_WorkGroupSize.y] = m.color;" NL "}";

		m_program = CreateProgramCS(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(5, m_storage_buffer);

		/* material buffer */
		{
			const float data[] = { 1.0f, 0.0f, 0.0f, 1.0f, 0.0f, 1.0f, 0.0f, 1.0f,
								   0.0f, 0.0f, 1.0f, 1.0f, 1.0f, 1.0f, 0.0f, 1.0f };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer[0]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_DRAW);
		}
		/* material id buffer */
		{
			const unsigned int data[] = { 2, 3, 0, 2 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storage_buffer[1]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_DRAW);
		}
		/* transform buffer */
		{
			const float data[] = { -0.5f, -0.5f, 0.5f, -0.5f, -0.5f, 0.5f, 0.5f, 0.5f };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 2, m_storage_buffer[2]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_DRAW);
		}
		/* transform id buffer */
		{
			const unsigned int data[] = { 3, 1, 0, 2 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 3, m_storage_buffer[3]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_DRAW);
		}

		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 4, m_storage_buffer[4]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 16 * 4 * 4 + 16 * 2 * 4, 0, GL_STATIC_DRAW);

		glUseProgram(m_program);
		glDispatchCompute(4, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		GLfloat* out_data =
			(GLfloat*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 16 * 4 * 4 + 16 * 2 * 4, GL_MAP_READ_BIT);
		if (!out_data)
			return ERROR;
		GLfloat expected[16 * 4 + 16 * 2] = {
			0.0f,  0.0f,  1.0f,  0.0f,  0.0f,  0.0f,  1.0f,  0.0f,  0.0f,  0.0f,  1.0f,  0.0f,  0.0f,  0.0f,
			1.0f,  0.0f,  1.0f,  1.0f,  0.0f,  0.0f,  1.0f,  1.0f,  0.0f,  0.0f,  1.0f,  1.0f,  0.0f,  0.0f,
			1.0f,  1.0f,  0.0f,  0.0f,  1.0f,  0.0f,  0.0f,  0.0f,  1.0f,  0.0f,  0.0f,  0.0f,  1.0f,  0.0f,
			0.0f,  0.0f,  1.0f,  0.0f,  0.0f,  0.0f,  0.0f,  0.0f,  1.0f,  0.0f,  0.0f,  0.0f,  1.0f,  0.0f,
			0.0f,  0.0f,  1.0f,  0.0f,  0.0f,  0.0f,  1.0f,  0.0f,  0.1f,  0.1f,  0.9f,  0.1f,  0.1f,  0.9f,
			0.9f,  0.9f,  0.1f,  -0.9f, 0.9f,  -0.9f, 0.1f,  -0.1f, 0.9f,  -0.1f, -0.9f, -0.9f, -0.1f, -0.9f,
			-0.9f, -0.1f, -0.1f, -0.1f, -0.9f, 0.1f,  -0.1f, 0.1f,  -0.9f, 0.9f,  -0.1f, 0.9f
		};
		for (int i = 0; i < 16; ++i)
		{
			if (out_data[i * 4 + 0] != expected[i * 4 + 0] || out_data[i * 4 + 1] != expected[i * 4 + 1] ||
				out_data[i * 4 + 2] != expected[i * 4 + 2])
			{
				Output("Received: %f, %f, %f, but expected: %f, %f, %f\n", out_data[i * 4 + 0], out_data[i * 4 + 1],
					   out_data[i * 4 + 2], expected[i * 4 + 0], expected[i * 4 + 1], expected[i * 4 + 2]);
				status = false;
			}
		}
		for (int i = 32; i < 32 + 16; ++i)
		{
			if (fabs(out_data[i * 2 + 0] - expected[i * 2 + 0]) > 1e-6 ||
				fabs(out_data[i * 2 + 1] - expected[i * 2 + 1]) > 1e-6)
			{
				Output("Received: %f, %f, but expected: %f, %f\n", out_data[i * 2 + 0], out_data[i * 2 + 1],
					   expected[i * 2 + 0], expected[i * 2 + 1]);
				status = false;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);

		/* update material id buffer with BufferSubData */
		{
			const unsigned int data[] = { 3, 2, 1, 0 };
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[1]);
			glBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), data);
		}

		/* update transform id buffer with BufferData */
		{
			const unsigned int data[] = { 0, 1, 2, 3 };
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[3]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_DRAW);
		}

		glUseProgram(m_program);
		glDispatchCompute(4, 1, 1);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[4]);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		GLfloat* out_data2 =
			(GLfloat*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 16 * 4 * 4 + 16 * 2 * 4, GL_MAP_READ_BIT);
		if (!out_data2)
			return ERROR;
		GLfloat expected2[16 * 4 + 16 * 2] = {
			1.0f,  1.0f,  0.0f,  0.0f,  1.0f,  1.0f,  0.0f,  0.0f,  1.0f, 1.0f,  0.0f, 0.0f,  1.0f, 1.0f,  0.0f, 0.0f,
			0.0f,  0.0f,  1.0f,  0.0f,  0.0f,  0.0f,  1.0f,  0.0f,  0.0f, 0.0f,  1.0f, 0.0f,  0.0f, 0.0f,  1.0f, 0.0f,
			0.0f,  1.0f,  0.0f,  0.0f,  0.0f,  1.0f,  0.0f,  0.0f,  0.0f, 1.0f,  0.0f, 0.0f,  0.0f, 1.0f,  0.0f, 0.0f,
			1.0f,  0.0f,  0.0f,  0.0f,  1.0f,  0.0f,  0.0f,  0.0f,  1.0f, 0.0f,  0.0f, 0.0f,  1.0f, 0.0f,  0.0f, 0.0f,
			-0.9f, -0.9f, -0.1f, -0.9f, -0.9f, -0.1f, -0.1f, -0.1f, 0.1f, -0.9f, 0.9f, -0.9f, 0.1f, -0.1f, 0.9f, -0.1f,
			-0.9f, 0.1f,  -0.1f, 0.1f,  -0.9f, 0.9f,  -0.1f, 0.9f,  0.1f, 0.1f,  0.9f, 0.1f,  0.1f, 0.9f,  0.9f, 0.9f
		};
		for (int i = 0; i < 16; ++i)
		{
			if (out_data2[i * 4 + 0] != expected2[i * 4 + 0] || out_data2[i * 4 + 1] != expected2[i * 4 + 1] ||
				out_data2[i * 4 + 2] != expected2[i * 4 + 2])
			{
				Output("Received: %f, %f, %f, but expected: %f, %f, %f\n", out_data2[i * 4 + 0], out_data2[i * 4 + 1],
					   out_data2[i * 4 + 2], expected2[i * 4 + 0], expected2[i * 4 + 1], expected2[i * 4 + 2]);
				status = false;
			}
		}
		for (int i = 32; i < 32 + 16; ++i)
		{
			if (fabs(out_data2[i * 2 + 0] - expected2[i * 2 + 0]) > 1e-6 ||
				fabs(out_data2[i * 2 + 1] - expected2[i * 2 + 1]) > 1e-6)
			{
				Output("Received: %f, %f, but expected: %f, %f\n", out_data2[i * 2 + 0], out_data2[i * 2 + 1],
					   expected2[i * 2 + 0], expected2[i * 2 + 1]);
				status = false;
			}
		}

		if (status)
			return NO_ERROR;
		else
			return ERROR;
	}